

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

FuncDef * sqlite3FindFunction(sqlite3 *db,char *zName,int nArg,u8 enc,u8 createFlag)

{
  int iVar1;
  int iVar2;
  FuncDef *pFVar3;
  FuncDef *pFVar4;
  int iVar5;
  bool bVar6;
  
  iVar1 = sqlite3Strlen30(zName);
  pFVar3 = (FuncDef *)sqlite3HashFind(&db->aFunc,zName);
  iVar5 = 0;
  pFVar4 = (FuncDef *)0x0;
  for (; pFVar3 != (FuncDef *)0x0; pFVar3 = pFVar3->pNext) {
    iVar2 = matchQuality(pFVar3,nArg,enc);
    if (iVar5 < iVar2) {
      pFVar4 = pFVar3;
      iVar5 = iVar2;
    }
  }
  if (createFlag == '\0') {
    if ((pFVar4 != (FuncDef *)0x0) && ((db->mDbFlags & 2) == 0)) {
      bVar6 = false;
      goto LAB_0012da9c;
    }
    iVar5 = 0;
    for (pFVar3 = sqlite3FunctionSearch(((uint)""[(byte)*zName] + iVar1) % 0x17,zName);
        pFVar3 != (FuncDef *)0x0; pFVar3 = pFVar3->pNext) {
      iVar2 = matchQuality(pFVar3,nArg,enc);
      if (iVar5 < iVar2) {
        pFVar4 = pFVar3;
        iVar5 = iVar2;
      }
    }
  }
  bVar6 = createFlag != '\0';
  if ((bVar6) && (iVar5 < 6)) {
    pFVar3 = (FuncDef *)sqlite3DbMallocZero(db,(ulong)(iVar1 + 0x49));
    if (pFVar3 == (FuncDef *)0x0) {
      return (FuncDef *)0x0;
    }
    pFVar4 = pFVar3 + 1;
    pFVar3->zName = &pFVar4->nArg;
    pFVar3->nArg = (i8)nArg;
    pFVar3->funcFlags = (uint)enc;
    memcpy(pFVar4,zName,(ulong)(iVar1 + 1));
    for (; (ulong)(byte)pFVar4->nArg != 0; pFVar4 = (FuncDef *)&pFVar4->field_0x1) {
      pFVar4->nArg = ""[(byte)pFVar4->nArg];
    }
    pFVar4 = (FuncDef *)sqlite3HashInsert(&db->aFunc,pFVar3->zName,pFVar3);
    if (pFVar4 == pFVar3) {
      sqlite3DbFreeNN(db,pFVar3);
      sqlite3OomFault(db);
      return (FuncDef *)0x0;
    }
    pFVar3->pNext = pFVar4;
    return pFVar3;
  }
  if (pFVar4 == (FuncDef *)0x0) {
    return (FuncDef *)0x0;
  }
LAB_0012da9c:
  if (bVar6) {
    return pFVar4;
  }
  if (pFVar4->xSFunc == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0) {
    return (FuncDef *)0x0;
  }
  return pFVar4;
}

Assistant:

SQLITE_PRIVATE FuncDef *sqlite3FindFunction(
  sqlite3 *db,       /* An open database */
  const char *zName, /* Name of the function.  zero-terminated */
  int nArg,          /* Number of arguments.  -1 means any number */
  u8 enc,            /* Preferred text encoding */
  u8 createFlag      /* Create new entry if true and does not otherwise exist */
){
  FuncDef *p;         /* Iterator variable */
  FuncDef *pBest = 0; /* Best match found so far */
  int bestScore = 0;  /* Score of best match */
  int h;              /* Hash value */
  int nName;          /* Length of the name */

  assert( nArg>=(-2) );
  assert( nArg>=(-1) || createFlag==0 );
  nName = sqlite3Strlen30(zName);

  /* First search for a match amongst the application-defined functions.
  */
  p = (FuncDef*)sqlite3HashFind(&db->aFunc, zName);
  while( p ){
    int score = matchQuality(p, nArg, enc);
    if( score>bestScore ){
      pBest = p;
      bestScore = score;
    }
    p = p->pNext;
  }

  /* If no match is found, search the built-in functions.
  **
  ** If the DBFLAG_PreferBuiltin flag is set, then search the built-in
  ** functions even if a prior app-defined function was found.  And give
  ** priority to built-in functions.
  **
  ** Except, if createFlag is true, that means that we are trying to
  ** install a new function.  Whatever FuncDef structure is returned it will
  ** have fields overwritten with new information appropriate for the
  ** new function.  But the FuncDefs for built-in functions are read-only.
  ** So we must not search for built-ins when creating a new function.
  */ 
  if( !createFlag && (pBest==0 || (db->mDbFlags & DBFLAG_PreferBuiltin)!=0) ){
    bestScore = 0;
    h = SQLITE_FUNC_HASH(sqlite3UpperToLower[(u8)zName[0]], nName);
    p = sqlite3FunctionSearch(h, zName);
    while( p ){
      int score = matchQuality(p, nArg, enc);
      if( score>bestScore ){
        pBest = p;
        bestScore = score;
      }
      p = p->pNext;
    }
  }

  /* If the createFlag parameter is true and the search did not reveal an
  ** exact match for the name, number of arguments and encoding, then add a
  ** new entry to the hash table and return it.
  */
  if( createFlag && bestScore<FUNC_PERFECT_MATCH && 
      (pBest = sqlite3DbMallocZero(db, sizeof(*pBest)+nName+1))!=0 ){
    FuncDef *pOther;
    u8 *z;
    pBest->zName = (const char*)&pBest[1];
    pBest->nArg = (u16)nArg;
    pBest->funcFlags = enc;
    memcpy((char*)&pBest[1], zName, nName+1);
    for(z=(u8*)pBest->zName; *z; z++) *z = sqlite3UpperToLower[*z];
    pOther = (FuncDef*)sqlite3HashInsert(&db->aFunc, pBest->zName, pBest);
    if( pOther==pBest ){
      sqlite3DbFree(db, pBest);
      sqlite3OomFault(db);
      return 0;
    }else{
      pBest->pNext = pOther;
    }
  }

  if( pBest && (pBest->xSFunc || createFlag) ){
    return pBest;
  }
  return 0;
}